

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param_bin(Net *this,FILE *fp)

{
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  bool bVar1;
  int iVar2;
  Layer *pLVar3;
  char *__ptr;
  int j;
  long lVar4;
  size_t sStack_610;
  int bottom_blob_index;
  int typeindex;
  int local_5f8;
  int top_count;
  int bottom_count;
  int layer_count;
  int blob_count;
  int magic;
  Net *local_5e0;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_5d8;
  ParamDict pd;
  
  magic = 0;
  bVar1 = readValue<int>(&magic,fp);
  if (bVar1) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      bVar1 = readValue<int>(&layer_count,fp);
      if (bVar1) {
        blob_count = 0;
        bVar1 = readValue<int>(&blob_count,fp);
        if (bVar1) {
          local_5d8 = &this->layers;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                    (local_5d8,(long)layer_count);
          this_00 = &this->blobs;
          local_5e0 = this;
          std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)blob_count);
          ParamDict::ParamDict(&pd);
          local_5f8 = 0;
          do {
            if (layer_count <= local_5f8) {
              iVar2 = 0;
LAB_0011ca3d:
              ParamDict::~ParamDict(&pd);
              return iVar2;
            }
            bVar1 = readValue<int>(&typeindex,fp);
            if (((!bVar1) || (bVar1 = readValue<int>(&bottom_count,fp), !bVar1)) ||
               (bVar1 = readValue<int>(&top_count,fp), !bVar1)) {
LAB_0011ca3a:
              iVar2 = -1;
              goto LAB_0011ca3d;
            }
            pLVar3 = create_layer(typeindex);
            if ((pLVar3 == (Layer *)0x0) &&
               (pLVar3 = create_custom_layer(local_5e0,typeindex & 0xfffffeff),
               pLVar3 == (Layer *)0x0)) {
              fprintf(_stderr,"layer %d not exists or registered\n",(ulong)(uint)typeindex);
              clear(local_5e0);
              goto LAB_0011ca3a;
            }
            std::vector<int,_std::allocator<int>_>::resize(&pLVar3->bottoms,(long)bottom_count);
            for (lVar4 = 0; lVar4 < bottom_count; lVar4 = lVar4 + 1) {
              bVar1 = readValue<int>(&bottom_blob_index,fp);
              if (!bVar1) goto LAB_0011ca3a;
              std::vector<int,_std::allocator<int>_>::push_back
                        (&(this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                          _M_impl.super__Vector_impl_data._M_start[bottom_blob_index].consumers,
                         &local_5f8);
              (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4] = bottom_blob_index;
            }
            std::vector<int,_std::allocator<int>_>::resize(&pLVar3->tops,(long)top_count);
            for (lVar4 = 0; lVar4 < top_count; lVar4 = lVar4 + 1) {
              bVar1 = readValue<int>(&bottom_blob_index,fp);
              if (!bVar1) goto LAB_0011ca3a;
              (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
              super__Vector_impl_data._M_start[bottom_blob_index].producer = local_5f8;
              (pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4] = bottom_blob_index;
            }
            iVar2 = ParamDict::load_param_bin(&pd,fp);
            if (iVar2 == 0) {
              iVar2 = (*pLVar3->_vptr_Layer[2])(pLVar3,&pd);
              if (iVar2 != 0) {
                __ptr = "layer load_param failed\n";
                sStack_610 = 0x18;
                goto LAB_0011c9e2;
              }
              (local_5d8->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
              .super__Vector_impl_data._M_start[local_5f8] = pLVar3;
            }
            else {
              __ptr = "ParamDict load_param failed\n";
              sStack_610 = 0x1c;
LAB_0011c9e2:
              fwrite(__ptr,sStack_610,1,_stderr);
            }
            local_5f8 = local_5f8 + 1;
          } while( true );
        }
      }
    }
    else {
      fwrite("param is too old, please regenerate\n",0x24,1,_stderr);
    }
  }
  return -1;
}

Assistant:

int Net::load_param_bin(FILE* fp)
{
    int magic = 0;
    if (!readValue(magic, fp))
        return -1;
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = 0;
    if (!readValue(layer_count, fp))
        return -1;

    int blob_count = 0;
    if (!readValue(blob_count, fp))
        return -1;

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (use_vulkan_compute && !vkdev)
    {
        // use default vulkan device
        if (!vkdev_local)
            vkdev_local = new VulkanDevice;
        vkdev = vkdev_local;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        if (!readValue(typeindex, fp))
            return -1;

        int bottom_count;
        if (!readValue(bottom_count, fp))
            return -1;

        int top_count;
        if (!readValue(top_count, fp))
            return -1;

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            if (!readValue(bottom_blob_index, fp))
                return -1;

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            if (!readValue(top_blob_index, fp))
                return -1;

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(fp);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

    return 0;
}